

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase289::run(TestCase289 *this)

{
  Reader *reader;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ReaderOptions options;
  Array<capnp::word> local_180;
  ArrayPtr<const_capnp::word> segments [1];
  Reader root;
  AlignedData<7> upgradedList;
  SegmentArrayMessageReader upgraded;
  
  segments[0].ptr = (word *)&upgradedList;
  upgradedList.words[4].content = (word)0x3300000001;
  upgradedList.words[5].content = (word)0x605040403020100;
  upgradedList.words[2].content = (word)0;
  upgradedList.words[3].content = (word)0;
  upgradedList.words[0].content = (word)0x4000000000000;
  upgradedList.words[1].content = (word)0;
  upgradedList.words[6].content = (word)0x10090807;
  segments[0].size_ = 7;
  segments_00.size_ = 1;
  segments_00.ptr = segments;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&upgraded,segments_00,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestLists>
            (&root,&upgraded.super_MessageReader);
  canonicalize<capnproto_test::capnp::test::TestLists::Reader&>(&local_180,(capnp *)&root,reader);
  kj::Array<capnp::word>::~Array(&local_180);
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&upgraded);
  return;
}

Assistant:

TEST(WireFormat, StructRoundTrip_OneSegment) {
  MallocMessageBuilder message;
  BuilderArena arena(&message);
  auto allocation = arena.allocate(1 * WORDS);
  SegmentBuilder* segment = allocation.segment;
  word* rootLocation = allocation.words;

  StructBuilder builder = PointerBuilder::getRoot(segment, nullptr, rootLocation)
      .initStruct(StructSize(2 * WORDS, 4 * POINTERS));
  setupStruct(builder);

  // word count:
  //    1  root pointer
  //    6  root struct
  //    1  sub message
  //    2  3-element int32 list
  //   13  struct list
  //         1 tag
  //        12 4x struct
  //           1 data section
  //           1 pointer section
  //           1 sub-struct
  //   11  list list
  //         5 pointers to sub-lists
  //         6 sub-lists (4x 1 word, 1x 2 words)
  // -----
  //   34
  kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = arena.getSegmentsForOutput();
  ASSERT_EQ(1u, segments.size());
  EXPECT_EQ(34u, segments[0].size());

  checkStruct(builder);
  checkStruct(builder.asReader());
  checkStruct(PointerReader::getRootUnchecked(segment->getStartPtr()).getStruct(nullptr));
  checkStruct(PointerReader::getRoot(segment, nullptr, segment->getStartPtr(), 4)
      .getStruct(nullptr));
}